

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_79::Parser::parseArray(Parser *this,Builder *output)

{
  Builder builder_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  bool bVar7;
  char cVar8;
  uint index;
  Orphan<capnp::json::Value> *pOVar9;
  size_t sVar10;
  unsigned_long *puVar11;
  Orphanage OVar12;
  Range<unsigned_long> RVar13;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  unsigned_long i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  Builder array;
  undefined1 local_120 [8];
  BuilderFor<capnp::json::Value> builder;
  Orphan<capnp::json::Value> orphan;
  undefined1 local_d0 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:686:5)>
  _kjDefer686;
  Fault f;
  undefined1 local_b0 [8];
  DebugComparison<unsigned_long_&,_const_unsigned_long_&> _kjCondition;
  bool expectComma;
  undefined1 local_48 [8];
  Orphanage orphanage;
  Vector<capnp::Orphan<capnp::json::Value>_> values;
  Builder *output_local;
  Parser *this_local;
  
  kj::Vector<capnp::Orphan<capnp::json::Value>_>::Vector
            ((Vector<capnp::Orphan<capnp::json::Value>_> *)&orphanage.capTable);
  uVar1 = (output->_builder).capTable;
  uVar2 = (output->_builder).data;
  uVar3 = (output->_builder).pointers;
  uVar4 = (output->_builder).dataSize;
  uVar5 = (output->_builder).pointerCount;
  uVar6 = *(undefined2 *)&(output->_builder).field_0x26;
  builder_00._builder.pointers._6_2_ = uVar6;
  builder_00._builder.pointers._4_2_ = uVar5;
  builder_00._builder.pointers._0_4_ = uVar4;
  builder_00._builder.data = (void *)uVar3;
  builder_00._builder.capTable = (CapTableBuilder *)uVar2;
  builder_00._builder.segment = (SegmentBuilder *)uVar1;
  builder_00._builder.dataSize = in_stack_fffffffffffffdf0;
  builder_00._builder._36_4_ = in_stack_fffffffffffffdf4;
  OVar12 = Orphanage::getForMessageContaining<capnp::json::Value::Builder>(builder_00);
  orphanage.arena = (BuilderArena *)OVar12.capTable;
  local_48 = (undefined1  [8])OVar12.arena;
  _kjCondition._35_1_ = 0;
  Input::consume(&this->input,'[');
  this->nestingDepth = this->nestingDepth + 1;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->nestingDepth);
  kj::_::DebugExpression<unsigned_long&>::operator<=
            ((DebugComparison<unsigned_long_&,_const_unsigned_long_&> *)local_b0,
             (DebugExpression<unsigned_long&> *)&f,&this->maxNestingDepth);
  bVar7 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
  if (!bVar7) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long_const&>&,char_const(&)[32]>
              ((Fault *)&_kjDefer686.maybeFunc.ptr.field_1.value,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x2ad,FAILED,"++nestingDepth <= maxNestingDepth",
               "_kjCondition,\"JSON message nested too deeply.\"",
               (DebugComparison<unsigned_long_&,_const_unsigned_long_&> *)local_b0,
               (char (*) [32])"JSON message nested too deeply.");
    kj::_::Debug::Fault::fatal((Fault *)&_kjDefer686.maybeFunc.ptr.field_1.value);
  }
  orphan.builder.location = (word *)this;
  kj::
  defer<capnp::(anonymous_namespace)::Parser::parseArray(capnp::json::Value::Builder&)::_lambda()_1_>
            ((kj *)local_d0,(Type *)&orphan.builder.location);
  while( true ) {
    Input::consumeWhitespace(&this->input);
    cVar8 = Input::nextChar(&this->input);
    if (cVar8 == ']') break;
    Orphanage::newOrphan<capnp::json::Value>
              ((Orphan<capnp::json::Value> *)&builder._builder.dataSize,(Orphanage *)local_48);
    Orphan<capnp::json::Value>::get
              ((BuilderFor<capnp::json::Value> *)local_120,
               (Orphan<capnp::json::Value> *)&builder._builder.dataSize);
    if ((_kjCondition._35_1_ & 1) != 0) {
      Input::consumeWhitespace(&this->input);
      Input::consume(&this->input,',');
      Input::consumeWhitespace(&this->input);
    }
    parseValue(this,(Builder *)local_120);
    pOVar9 = kj::mv<capnp::Orphan<capnp::json::Value>>
                       ((Orphan<capnp::json::Value> *)&builder._builder.dataSize);
    kj::Vector<capnp::Orphan<capnp::json::Value>>::add<capnp::Orphan<capnp::json::Value>>
              ((Vector<capnp::Orphan<capnp::json::Value>> *)&orphanage.capTable,pOVar9);
    _kjCondition._35_1_ = 1;
    Orphan<capnp::json::Value>::~Orphan((Orphan<capnp::json::Value> *)&builder._builder.dataSize);
  }
  sVar10 = kj::Vector<capnp::Orphan<capnp::json::Value>_>::size
                     ((Vector<capnp::Orphan<capnp::json::Value>_> *)&orphanage.capTable);
  json::Value::Builder::initArray((Builder *)&array.builder.structDataSize,output,(uint)sVar10);
  json::Value::Builder::getArray((Builder *)&__range2,output);
  RVar13 = kj::indices<kj::Vector<capnp::Orphan<capnp::json::Value>>&>
                     ((Vector<capnp::Orphan<capnp::json::Value>_> *)&orphanage.capTable);
  __begin2.value = RVar13.begin_;
  __end2 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
  i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
  while( true ) {
    bVar7 = kj::Range<unsigned_long>::Iterator::operator==(&__end2,(Iterator *)&i);
    if (((bVar7 ^ 0xffU) & 1) == 0) break;
    puVar11 = kj::Range<unsigned_long>::Iterator::operator*(&__end2);
    index = (uint)*puVar11;
    pOVar9 = kj::Vector<capnp::Orphan<capnp::json::Value>_>::operator[]
                       ((Vector<capnp::Orphan<capnp::json::Value>_> *)&orphanage.capTable,*puVar11);
    pOVar9 = kj::mv<capnp::Orphan<capnp::json::Value>>(pOVar9);
    List<capnp::json::Value,_(capnp::Kind)3>::Builder::adoptWithCaveats
              ((Builder *)&__range2,index,pOVar9);
    kj::Range<unsigned_long>::Iterator::operator++(&__end2);
  }
  Input::consume(&this->input,']');
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++:686:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:686:5)>
               *)local_d0);
  kj::Vector<capnp::Orphan<capnp::json::Value>_>::~Vector
            ((Vector<capnp::Orphan<capnp::json::Value>_> *)&orphanage.capTable);
  return;
}

Assistant:

void parseArray(JsonValue::Builder& output) {
    // TODO(perf): Using orphans leaves holes in the message. It's expected
    // that a JsonValue is used for interop, and won't be sent or written as a
    // Cap'n Proto message.  This also applies to parseObject below.
    kj::Vector<Orphan<JsonValue>> values;
    auto orphanage = Orphanage::getForMessageContaining(output);
    bool expectComma = false;

    input.consume('[');
    KJ_REQUIRE(++nestingDepth <= maxNestingDepth, "JSON message nested too deeply.");
    KJ_DEFER(--nestingDepth);

    while (input.consumeWhitespace(), input.nextChar() != ']') {
      auto orphan = orphanage.newOrphan<JsonValue>();
      auto builder = orphan.get();

      if (expectComma) {
        input.consumeWhitespace();
        input.consume(',');
        input.consumeWhitespace();
      }

      parseValue(builder);
      values.add(kj::mv(orphan));

      expectComma = true;
    }

    output.initArray(values.size());
    auto array = output.getArray();

    for (auto i : kj::indices(values)) {
      array.adoptWithCaveats(i, kj::mv(values[i]));
    }

    input.consume(']');
  }